

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O1

int mbedtls_asn1_write_algorithm_identifier
              (uchar **p,uchar *start,char *oid,size_t oid_len,size_t par_len)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  
  if (par_len == 0) {
    puVar1 = *p;
    if ((long)puVar1 - (long)start < 1) {
      uVar2 = 0xffffff94;
    }
    else {
      *p = puVar1 + -1;
      puVar1[-1] = '\0';
      uVar2 = 1;
    }
    if (puVar1 != start && -1 < (long)puVar1 - (long)start) {
      puVar1 = *p;
      if (puVar1 == start || (long)puVar1 - (long)start < 0) {
        iVar5 = -0x6c;
        uVar2 = 0;
      }
      else {
        *p = puVar1 + -1;
        puVar1[-1] = '\x05';
        iVar5 = 1;
      }
      uVar2 = uVar2 + iVar5;
    }
    if ((int)uVar2 < 0) {
      return uVar2;
    }
    par_len = (size_t)uVar2;
  }
  uVar3 = mbedtls_asn1_write_oid(p,start,oid,oid_len);
  uVar2 = uVar3;
  if (-1 < (int)uVar3) {
    uVar4 = mbedtls_asn1_write_len(p,start,par_len + uVar3);
    uVar2 = uVar4;
    if (-1 < (int)uVar4) {
      puVar1 = *p;
      if ((long)puVar1 - (long)start < 1) {
        uVar2 = 0xffffff94;
      }
      else {
        *p = puVar1 + -1;
        puVar1[-1] = '0';
        uVar2 = 1;
      }
      if (puVar1 != start && -1 < (long)puVar1 - (long)start) {
        uVar2 = uVar4 + (int)(par_len + uVar3) + uVar2;
      }
    }
  }
  return uVar2;
}

Assistant:

int mbedtls_asn1_write_algorithm_identifier( unsigned char **p, unsigned char *start,
                                     const char *oid, size_t oid_len,
                                     size_t par_len )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0;

    if( par_len == 0 )
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_null( p, start ) );
    else
        len += par_len;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_oid( p, start, oid, oid_len ) );

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start,
                                       MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) );

    return( (int) len );
}